

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::SwiftCompilerShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llvm::StringRef)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  long lVar3;
  BuildEngineDelegate *pBVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  char *pcVar9;
  ulong uVar10;
  TaskInterface local_d8;
  long local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pcVar9 = message.Data;
  local_d8.impl = *(void **)((long)this + 8);
  local_d8.ctx = *(void **)((long)this + 0x10);
  pBVar4 = llbuild::core::TaskInterface::delegate(&local_d8);
  p_Var1 = pBVar4[1]._vptr_BuildEngineDelegate[1];
  uVar2 = *(undefined8 *)((long)this + 0x28);
  lVar3 = *(long *)((long)this + 0x18);
  local_50 = &local_40;
  if (lVar3 == 0) {
    local_48 = 0;
    local_40 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,lVar3,*(long *)((long)this + 0x20) + lVar3);
  }
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1ef7a7);
  local_70 = &local_60;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0 = &local_a0;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_a0 = *puVar8;
    uStack_98 = (undefined4)plVar5[3];
    uStack_94 = *(undefined4 *)((long)plVar5 + 0x1c);
  }
  else {
    local_a0 = *puVar8;
    local_b0 = (ulong *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_90 = &local_80;
  if (pcVar9 == (char *)0x0) {
    local_88 = 0;
    local_80 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar9,pcVar9 + message.Length);
  }
  uVar10 = 0xf;
  if (local_b0 != &local_a0) {
    uVar10 = local_a0;
  }
  if (uVar10 < (ulong)(local_88 + local_a8)) {
    uVar10 = 0xf;
    if (local_90 != &local_80) {
      uVar10 = CONCAT71(uStack_7f,local_80);
    }
    if ((ulong)(local_88 + local_a8) <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00198f65;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_00198f65:
  local_d8.impl = &local_c8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_c8 = *plVar5;
    uStack_c0 = *(undefined4 *)(puVar6 + 3);
    uStack_bc = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_c8 = *plVar5;
    local_d8.impl = (long *)*puVar6;
  }
  local_d8.ctx = (void *)puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  (**(code **)(*(long *)p_Var1 + 0x58))(p_Var1,uVar2,local_d8.impl,local_d8.ctx);
  if ((long *)local_d8.impl != &local_c8) {
    operator_delete(local_d8.impl,local_c8 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  *(int *)((long)this + 0x30) = *(int *)((long)this + 0x30) + 1;
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
        getBuildSystem(ti).getDelegate().commandHadError(command,
                       "error reading dependency file '" + depsPath.str() +
                       "': " + message.str());
        ++numErrors;
      }